

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O3

void av1_mv_pred(AV1_COMP *cpi,MACROBLOCK *x,uint8_t *ref_y_buffer,int ref_y_stride,int ref_frame,
                BLOCK_SIZE block_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  ushort uVar6;
  ushort uVar7;
  undefined1 auVar8 [13];
  uint5 uVar9;
  bool bVar10;
  undefined1 auVar11 [13];
  bool bVar12;
  int_mv iVar13;
  int_mv iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int *piVar18;
  ushort uVar19;
  uint uVar20;
  int i;
  long lVar21;
  AV1_COMP *pAVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  undefined1 uVar27;
  uint uVar26;
  uint uVar28;
  ushort uVar29;
  short sVar35;
  short sVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  MV_REFERENCE_FRAME ref_frames [2];
  MV pred_mv [3];
  MV_REFERENCE_FRAME local_72 [2];
  AV1_COMP *local_70;
  int_mv local_64 [3];
  long local_58;
  long local_50;
  int *local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  local_72[0] = (MV_REFERENCE_FRAME)ref_frame;
  local_72[1] = 0xff;
  bVar10 = false;
  local_70 = cpi;
  local_38 = ref_y_buffer;
  iVar13 = av1_get_ref_mv_from_stack(0,local_72,0,&x->mbmi_ext);
  iVar14 = av1_get_ref_mv_from_stack(0,local_72,1,&x->mbmi_ext);
  local_64[0] = iVar13;
  lVar25 = 1;
  if (iVar13.as_int != iVar14.as_int) {
    local_64[1] = iVar14;
    lVar25 = 2;
  }
  local_40 = x->plane[0].src.buf;
  lVar17 = (long)ref_frame;
  local_58 = lVar17;
  local_48 = x->pred_mv0_sad + lVar17;
  iVar23 = 0x7fffffff;
  local_50 = (ulong)block_size * 0x70;
  lVar21 = 0;
  uVar24 = 0;
  pAVar22 = local_70;
  auVar40 = _DAT_00504cd0;
  auVar41 = _DAT_00504ce0;
  do {
    uVar1 = (pAVar22->common).mi_params.mi_rows;
    uVar3 = (pAVar22->common).mi_params.mi_cols;
    uVar5._0_1_ = (x->e_mbd).width;
    uVar5._1_1_ = (x->e_mbd).height;
    uVar5._2_2_ = *(undefined2 *)&(x->e_mbd).field_0x2076;
    uVar27 = (undefined1)((ushort)uVar5._2_2_ >> 8);
    auVar8[0xc] = uVar27;
    auVar8._0_12_ = ZEXT712(0);
    uVar9 = CONCAT32(auVar8._10_3_,(ushort)(byte)uVar5._2_2_);
    auVar11._5_8_ = 0;
    auVar11._0_5_ = uVar9;
    uVar2 = (x->e_mbd).mi_row;
    uVar4 = (x->e_mbd).mi_col;
    auVar37._0_4_ = (uVar1 - uVar2) * 0x20 + auVar40._0_4_;
    auVar37._4_4_ = (uVar3 - uVar4) * 0x20 + auVar40._4_4_;
    auVar37._8_4_ = auVar40._8_4_;
    auVar37._12_4_ = auVar40._12_4_;
    auVar30._0_4_ = (int)CONCAT72(SUB137(auVar11 << 0x40,6),(ushort)(byte)uVar5._1_1_) + uVar2;
    auVar30._4_4_ = (uVar5 & 0xff) + uVar4;
    auVar30._8_4_ = (int)uVar9;
    auVar30[0xc] = uVar27;
    auVar30._13_3_ = 0;
    auVar38._8_2_ = 0xffff;
    auVar38._0_8_ = 0xffffffffffffffff;
    auVar38._10_2_ = 0xffff;
    auVar38._12_2_ = 0xffff;
    auVar38._14_2_ = 0xffff;
    auVar30 = auVar30 ^ auVar38;
    auVar31._0_4_ = auVar30._0_4_ << 5;
    auVar31._4_4_ = auVar30._4_4_ << 5;
    auVar31._8_4_ = auVar30._8_4_ << 5;
    auVar31._12_4_ = auVar30._12_4_ << 5;
    auVar38 = pshuflw(in_XMM3,ZEXT416(local_64[lVar21].as_int),0x60);
    in_XMM3._0_4_ = auVar38._0_4_ >> 0x10;
    in_XMM3._4_4_ = auVar38._4_4_ >> 0x10;
    in_XMM3._8_4_ = auVar38._8_4_ >> 0x10;
    in_XMM3._12_4_ = auVar38._12_4_ >> 0x10;
    auVar32._0_4_ = -(uint)(in_XMM3._0_4_ < auVar31._0_4_);
    auVar32._4_4_ = -(uint)(in_XMM3._4_4_ < auVar31._4_4_);
    auVar32._8_4_ = -(uint)(in_XMM3._8_4_ < auVar31._8_4_);
    auVar32._12_4_ = -(uint)(in_XMM3._12_4_ < auVar31._12_4_);
    auVar39._0_4_ = -(uint)(in_XMM3._0_4_ < auVar37._0_4_);
    auVar39._4_4_ = -(uint)(in_XMM3._4_4_ < auVar37._4_4_);
    auVar39._8_4_ = -(uint)(in_XMM3._8_4_ < auVar40._8_4_);
    auVar39._12_4_ = -(uint)(in_XMM3._12_4_ < auVar40._12_4_);
    in_XMM3 = in_XMM3 & auVar39;
    auVar38 = ~auVar32 & (~auVar39 & auVar37 | in_XMM3) | auVar31 & auVar32;
    auVar32 = pshuflw(auVar31 & auVar32,auVar38,0xe8);
    uVar26 = (uint)auVar38._0_2_;
    uVar28 = (uint)auVar38._4_2_;
    uVar5 = -uVar26;
    if (0 < (int)uVar26) {
      uVar5 = uVar26;
    }
    uVar20 = -uVar28;
    if (0 < (int)uVar28) {
      uVar20 = uVar28;
    }
    if (uVar20 < uVar5) {
      uVar20 = uVar5;
    }
    local_64[lVar21].as_int = auVar32._0_4_;
    uVar29 = auVar32._0_2_;
    uVar6 = auVar32._2_2_;
    if (uVar24 <= uVar20 >> 3) {
      uVar7 = -uVar29;
      if (0 < (short)uVar29) {
        uVar7 = uVar29;
      }
      uVar5 = CONCAT22(uVar6,uVar7);
      uVar19 = -uVar6;
      if (0 < (short)uVar6) {
        uVar19 = uVar6;
      }
      if (uVar19 < uVar7) {
        uVar19 = uVar7;
      }
      uVar24 = (uint)(uVar19 >> 3);
    }
    auVar33._0_2_ = -(ushort)(-1 < (short)uVar29);
    sVar35 = -(ushort)(-1 < auVar32._4_2_);
    sVar36 = -(ushort)(-1 < auVar32._6_2_);
    auVar33._8_8_ =
         (undefined8)
         (CONCAT64(CONCAT42(CONCAT22(sVar36,sVar36),sVar35),CONCAT22(sVar35,sVar36)) >> 0x10);
    auVar33._6_2_ = -(ushort)(-1 < (short)uVar6);
    auVar33._4_2_ = -(ushort)(-1 < (short)uVar6);
    auVar33._2_2_ = auVar33._0_2_;
    uVar26 = uVar26 + SUB164(auVar33 & auVar41,0) + 3;
    uVar28 = uVar28 + SUB164(auVar33 & auVar41,4) + 3;
    auVar34._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar26 ^ 0x80000000));
    auVar34._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar26 ^ 0x80000000));
    auVar34._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar28 ^ 0x80000000));
    auVar34._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar28 ^ 0x80000000));
    iVar16 = movmskpd(uVar5,auVar34);
    if ((iVar16 != 0) || (bVar12 = true, !bVar10)) {
      iVar15 = (**(code **)((long)&pAVar22->ppi->fn_ptr[0].sdf + local_50))
                         (local_40,x->plane[0].src.stride,
                          local_38 + (((int)uVar26 >> 3) * ref_y_stride + ((int)uVar28 >> 3)));
      auVar41 = _DAT_00504ce0;
      auVar40 = _DAT_00504cd0;
      if (iVar15 < iVar23) {
        iVar23 = iVar15;
      }
      piVar18 = x->pred_mv1_sad + lVar17;
      if (lVar21 == 0) {
        piVar18 = local_48;
      }
      *piVar18 = iVar15;
      pAVar22 = local_70;
      bVar12 = (bool)(bVar10 | iVar16 == 0);
    }
    bVar10 = bVar12;
    lVar21 = lVar21 + 1;
  } while (lVar25 != lVar21);
  x->max_mv_context[local_58] = uVar24;
  x->pred_mv_sad[local_58] = iVar23;
  return;
}

Assistant:

void av1_mv_pred(const AV1_COMP *cpi, MACROBLOCK *x, uint8_t *ref_y_buffer,
                 int ref_y_stride, int ref_frame, BLOCK_SIZE block_size) {
  const MV_REFERENCE_FRAME ref_frames[2] = { ref_frame, NONE_FRAME };
  const int_mv ref_mv =
      av1_get_ref_mv_from_stack(0, ref_frames, 0, &x->mbmi_ext);
  const int_mv ref_mv1 =
      av1_get_ref_mv_from_stack(0, ref_frames, 1, &x->mbmi_ext);
  MV pred_mv[MAX_MV_REF_CANDIDATES + 1];
  int num_mv_refs = 0;
  pred_mv[num_mv_refs++] = ref_mv.as_mv;
  if (ref_mv.as_int != ref_mv1.as_int) {
    pred_mv[num_mv_refs++] = ref_mv1.as_mv;
  }

  assert(num_mv_refs <= (int)(sizeof(pred_mv) / sizeof(pred_mv[0])));

  const uint8_t *const src_y_ptr = x->plane[0].src.buf;
  int zero_seen = 0;
  int best_sad = INT_MAX;
  int max_mv = 0;
  // Get the sad for each candidate reference mv.
  for (int i = 0; i < num_mv_refs; ++i) {
    MV *this_mv = &pred_mv[i];
    enc_clamp_mv(&cpi->common, &x->e_mbd, this_mv);

    const int fp_row = (this_mv->row + 3 + (this_mv->row >= 0)) >> 3;
    const int fp_col = (this_mv->col + 3 + (this_mv->col >= 0)) >> 3;
    max_mv = AOMMAX(max_mv, AOMMAX(abs(this_mv->row), abs(this_mv->col)) >> 3);

    if (fp_row == 0 && fp_col == 0 && zero_seen) continue;
    zero_seen |= (fp_row == 0 && fp_col == 0);

    const uint8_t *const ref_y_ptr =
        &ref_y_buffer[ref_y_stride * fp_row + fp_col];
    // Find sad for current vector.
    const int this_sad = cpi->ppi->fn_ptr[block_size].sdf(
        src_y_ptr, x->plane[0].src.stride, ref_y_ptr, ref_y_stride);
    // Note if it is the best so far.
    if (this_sad < best_sad) {
      best_sad = this_sad;
    }
    if (i == 0)
      x->pred_mv0_sad[ref_frame] = this_sad;
    else if (i == 1)
      x->pred_mv1_sad[ref_frame] = this_sad;
  }

  // Note the index of the mv that worked best in the reference list.
  x->max_mv_context[ref_frame] = max_mv;
  x->pred_mv_sad[ref_frame] = best_sad;
}